

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::SubGridIntersector1Pluecker<8,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  Geometry *pGVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  RTCRayQueryContext *pRVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  byte bVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  byte bVar41;
  byte bVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  uint uVar47;
  ulong uVar48;
  long lVar49;
  RTCIntersectArguments *pRVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  uint uVar54;
  float fVar55;
  float fVar89;
  float fVar90;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar91;
  undefined1 auVar61 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined4 uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar103;
  float fVar106;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  PlueckerHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_27d0;
  undefined1 local_27c1;
  ulong *local_27c0;
  ulong local_27b8;
  RTCRayQueryContext *local_27b0;
  Scene *local_27a8;
  int local_279c;
  RTCIntersectArguments *local_2798;
  ulong local_2790;
  ulong local_2788;
  ulong local_2780;
  ulong local_2778;
  ulong local_2770;
  ulong local_2768;
  ulong local_2760;
  ulong local_2758;
  long local_2750;
  ulong local_2748;
  ulong local_2740;
  ulong local_2738;
  ulong local_2730;
  ulong local_2728;
  ulong local_2720;
  long local_2718;
  long local_2710;
  ulong local_2708;
  RTCFilterFunctionNArguments local_2700;
  float local_26d0;
  float local_26cc;
  float local_26c8;
  undefined4 local_26c4;
  undefined4 local_26c0;
  undefined4 local_26bc;
  undefined4 local_26b8;
  uint local_26b4;
  uint local_26b0;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [8];
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined1 local_2580 [8];
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 local_2560;
  undefined4 uStack_255c;
  undefined4 uStack_2558;
  undefined4 uStack_2554;
  undefined4 uStack_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined1 local_2500 [32];
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 *local_24a0;
  uint local_2498;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar58 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2398[0] = 0;
    if (local_23a0 != 8) {
      aVar8 = (ray->super_RayK<1>).dir.field_0;
      auVar61 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar21 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar56._8_4_ = 0x7fffffff;
      auVar56._0_8_ = 0x7fffffff7fffffff;
      auVar56._12_4_ = 0x7fffffff;
      auVar56 = vandps_avx512vl((undefined1  [16])aVar8,auVar56);
      auVar57._8_4_ = 0x219392ef;
      auVar57._0_8_ = 0x219392ef219392ef;
      auVar57._12_4_ = 0x219392ef;
      uVar53 = vcmpps_avx512vl(auVar56,auVar57,1);
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = &DAT_3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar56 = vdivps_avx(auVar109,(undefined1  [16])aVar8);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar20 = (bool)((byte)uVar53 & 1);
      auVar58._0_4_ = (uint)bVar20 * auVar57._0_4_ | (uint)!bVar20 * auVar56._0_4_;
      bVar20 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar20 * auVar57._4_4_ | (uint)!bVar20 * auVar56._4_4_;
      bVar20 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar20 * auVar57._8_4_ | (uint)!bVar20 * auVar56._8_4_;
      bVar20 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar20 * auVar57._12_4_ | (uint)!bVar20 * auVar56._12_4_;
      auVar59._8_4_ = 0x3f7ffffa;
      auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar59._12_4_ = 0x3f7ffffa;
      auVar59 = vmulps_avx512vl(auVar58,auVar59);
      auVar60._8_4_ = 0x3f800003;
      auVar60._0_8_ = 0x3f8000033f800003;
      auVar60._12_4_ = 0x3f800003;
      auVar60 = vmulps_avx512vl(auVar58,auVar60);
      local_2600 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar127 = ZEXT3264(local_2600);
      local_2620 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar128 = ZEXT3264(local_2620);
      local_2640 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar129 = ZEXT3264(local_2640);
      local_27c0 = local_2390;
      bVar20 = auVar59._0_4_ < 0.0;
      local_2660 = vbroadcastss_avx512vl(auVar59);
      auVar130 = ZEXT3264(local_2660);
      auVar56 = vmovshdup_avx(auVar59);
      local_2680 = vbroadcastsd_avx512vl(auVar56);
      auVar131 = ZEXT3264(local_2680);
      auVar57 = vshufpd_avx(auVar59,auVar59,1);
      auVar62._8_4_ = 2;
      auVar62._0_8_ = 0x200000002;
      auVar62._12_4_ = 2;
      auVar62._16_4_ = 2;
      auVar62._20_4_ = 2;
      auVar62._24_4_ = 2;
      auVar62._28_4_ = 2;
      _local_2580 = vpermps_avx2(auVar62,ZEXT1632(auVar59));
      uVar95 = auVar60._0_4_;
      local_25a0._4_4_ = uVar95;
      local_25a0._0_4_ = uVar95;
      fStack_2598 = (float)uVar95;
      fStack_2594 = (float)uVar95;
      fStack_2590 = (float)uVar95;
      fStack_258c = (float)uVar95;
      fStack_2588 = (float)uVar95;
      register0x0000141c = uVar95;
      auVar63._8_4_ = 1;
      auVar63._0_8_ = 0x100000001;
      auVar63._12_4_ = 1;
      auVar63._16_4_ = 1;
      auVar63._20_4_ = 1;
      auVar63._24_4_ = 1;
      auVar63._28_4_ = 1;
      _local_2520 = vpermps_avx2(auVar63,ZEXT1632(auVar60));
      _local_2540 = vpermps_avx2(auVar62,ZEXT1632(auVar60));
      auVar116 = ZEXT3264(_local_2580);
      local_2720 = (ulong)bVar20 << 5;
      auVar113 = ZEXT3264(_local_25a0);
      local_2728 = (ulong)(auVar56._0_4_ < 0.0) << 5 | 0x40;
      local_2730 = (ulong)(auVar57._0_4_ < 0.0) << 5 | 0x80;
      local_2738 = local_2720 ^ 0x20;
      local_2560 = auVar61._0_4_;
      uStack_255c = local_2560;
      uStack_2558 = local_2560;
      uStack_2554 = local_2560;
      uStack_2550 = local_2560;
      uStack_254c = local_2560;
      uStack_2548 = local_2560;
      uStack_2544 = local_2560;
      local_25e0 = auVar21._0_4_;
      fStack_25dc = local_25e0;
      fStack_25d8 = local_25e0;
      fStack_25d4 = local_25e0;
      fStack_25d0 = local_25e0;
      fStack_25cc = local_25e0;
      fStack_25c8 = local_25e0;
      fStack_25c4 = local_25e0;
      local_2758 = (ulong)(((uint)bVar20 << 5) >> 2);
      local_2760 = local_2738 >> 2;
      local_2768 = local_2728 >> 2;
      local_2740 = local_2728 ^ 0x20;
      local_2770 = (local_2728 ^ 0x20) >> 2;
      local_2778 = local_2730 >> 2;
      local_2748 = local_2730 ^ 0x20;
      local_2780 = (local_2730 ^ 0x20) >> 2;
      auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar114 = ZEXT3264(auVar62);
      auVar111 = ZEXT3264(CONCAT428(0xfffffff8,
                                    CONCAT424(0xfffffff8,
                                              CONCAT420(0xfffffff8,
                                                        CONCAT416(0xfffffff8,
                                                                  CONCAT412(0xfffffff8,
                                                                            CONCAT48(0xfffffff8,
                                                                                                                                                                          
                                                  0xfffffff8fffffff8)))))));
      do {
        do {
          do {
            if (local_27c0 == &local_23a0) {
              return;
            }
            pfVar7 = (float *)(local_27c0 + -1);
            local_27c0 = local_27c0 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar7);
          local_27d0 = *local_27c0;
          do {
            if ((local_27d0 & 8) == 0) {
              auVar62 = vsubps_avx512vl(*(undefined1 (*) [32])(local_27d0 + 0x40 + local_2720),
                                        auVar127._0_32_);
              auVar62 = vmulps_avx512vl(auVar130._0_32_,auVar62);
              auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(local_27d0 + 0x40 + local_2728),
                                        auVar128._0_32_);
              auVar63 = vmulps_avx512vl(auVar131._0_32_,auVar63);
              auVar62 = vmaxps_avx(auVar62,auVar63);
              auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(local_27d0 + 0x40 + local_2730),
                                        auVar129._0_32_);
              auVar65._4_4_ = auVar116._4_4_ * auVar63._4_4_;
              auVar65._0_4_ = auVar116._0_4_ * auVar63._0_4_;
              auVar65._8_4_ = auVar116._8_4_ * auVar63._8_4_;
              auVar65._12_4_ = auVar116._12_4_ * auVar63._12_4_;
              auVar65._16_4_ = auVar116._16_4_ * auVar63._16_4_;
              auVar65._20_4_ = auVar116._20_4_ * auVar63._20_4_;
              auVar65._24_4_ = auVar116._24_4_ * auVar63._24_4_;
              auVar65._28_4_ = auVar63._28_4_;
              auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(local_27d0 + 0x40 + local_2738),
                                        auVar127._0_32_);
              auVar64._4_4_ = auVar113._4_4_ * auVar63._4_4_;
              auVar64._0_4_ = auVar113._0_4_ * auVar63._0_4_;
              auVar64._8_4_ = auVar113._8_4_ * auVar63._8_4_;
              auVar64._12_4_ = auVar113._12_4_ * auVar63._12_4_;
              auVar64._16_4_ = auVar113._16_4_ * auVar63._16_4_;
              auVar64._20_4_ = auVar113._20_4_ * auVar63._20_4_;
              auVar64._24_4_ = auVar113._24_4_ * auVar63._24_4_;
              auVar64._28_4_ = auVar63._28_4_;
              auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(local_27d0 + 0x40 + local_2740),
                                        auVar128._0_32_);
              auVar66._4_4_ = auVar63._4_4_ * (float)local_2520._4_4_;
              auVar66._0_4_ = auVar63._0_4_ * (float)local_2520._0_4_;
              auVar66._8_4_ = auVar63._8_4_ * fStack_2518;
              auVar66._12_4_ = auVar63._12_4_ * fStack_2514;
              auVar66._16_4_ = auVar63._16_4_ * fStack_2510;
              auVar66._20_4_ = auVar63._20_4_ * fStack_250c;
              auVar66._24_4_ = auVar63._24_4_ * fStack_2508;
              auVar66._28_4_ = auVar63._28_4_;
              auVar64 = vminps_avx(auVar64,auVar66);
              auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])(local_27d0 + 0x40 + local_2748),
                                        auVar129._0_32_);
              auVar67._4_4_ = auVar63._4_4_ * (float)local_2540._4_4_;
              auVar67._0_4_ = auVar63._0_4_ * (float)local_2540._0_4_;
              auVar67._8_4_ = auVar63._8_4_ * fStack_2538;
              auVar67._12_4_ = auVar63._12_4_ * fStack_2534;
              auVar67._16_4_ = auVar63._16_4_ * fStack_2530;
              auVar67._20_4_ = auVar63._20_4_ * fStack_252c;
              auVar67._24_4_ = auVar63._24_4_ * fStack_2528;
              auVar67._28_4_ = auVar63._28_4_;
              auVar69._4_4_ = uStack_255c;
              auVar69._0_4_ = local_2560;
              auVar69._8_4_ = uStack_2558;
              auVar69._12_4_ = uStack_2554;
              auVar69._16_4_ = uStack_2550;
              auVar69._20_4_ = uStack_254c;
              auVar69._24_4_ = uStack_2548;
              auVar69._28_4_ = uStack_2544;
              auVar63 = vmaxps_avx(auVar65,auVar69);
              local_26a0 = vmaxps_avx(auVar62,auVar63);
              auVar68._4_4_ = fStack_25dc;
              auVar68._0_4_ = local_25e0;
              auVar68._8_4_ = fStack_25d8;
              auVar68._12_4_ = fStack_25d4;
              auVar68._16_4_ = fStack_25d0;
              auVar68._20_4_ = fStack_25cc;
              auVar68._24_4_ = fStack_25c8;
              auVar68._28_4_ = fStack_25c4;
              auVar62 = vminps_avx(auVar67,auVar68);
              auVar62 = vminps_avx(auVar64,auVar62);
              uVar22 = vcmpps_avx512vl(local_26a0,auVar62,2);
              local_2788 = CONCAT44((int)(local_27d0 >> 0x20),(uint)(byte)uVar22);
            }
            if ((local_27d0 & 8) == 0) {
              if (local_2788 == 0) {
                iVar43 = 4;
              }
              else {
                auVar62 = *(undefined1 (*) [32])(local_27d0 & 0xfffffffffffffff0);
                auVar63 = ((undefined1 (*) [32])(local_27d0 & 0xfffffffffffffff0))[1];
                auVar64 = vpternlogd_avx512vl(auVar114._0_32_,auVar111._0_32_,local_26a0,0xf8);
                uVar53 = local_2788 & 0xffffffff;
                auVar65 = vpcompressd_avx512vl(auVar64);
                bVar20 = (bool)((byte)uVar53 & 1);
                auVar70._0_4_ = (uint)bVar20 * auVar65._0_4_ | (uint)!bVar20 * auVar64._0_4_;
                bVar20 = (bool)((byte)(uVar53 >> 1) & 1);
                auVar70._4_4_ = (uint)bVar20 * auVar65._4_4_ | (uint)!bVar20 * auVar64._4_4_;
                bVar20 = (bool)((byte)(uVar53 >> 2) & 1);
                auVar70._8_4_ = (uint)bVar20 * auVar65._8_4_ | (uint)!bVar20 * auVar64._8_4_;
                bVar20 = (bool)((byte)(uVar53 >> 3) & 1);
                auVar70._12_4_ = (uint)bVar20 * auVar65._12_4_ | (uint)!bVar20 * auVar64._12_4_;
                bVar20 = (bool)((byte)(uVar53 >> 4) & 1);
                auVar70._16_4_ = (uint)bVar20 * auVar65._16_4_ | (uint)!bVar20 * auVar64._16_4_;
                bVar20 = (bool)((byte)(uVar53 >> 5) & 1);
                auVar70._20_4_ = (uint)bVar20 * auVar65._20_4_ | (uint)!bVar20 * auVar64._20_4_;
                bVar20 = (bool)((byte)(uVar53 >> 6) & 1);
                auVar70._24_4_ = (uint)bVar20 * auVar65._24_4_ | (uint)!bVar20 * auVar64._24_4_;
                bVar20 = (bool)((byte)(uVar53 >> 7) & 1);
                auVar70._28_4_ = (uint)bVar20 * auVar65._28_4_ | (uint)!bVar20 * auVar64._28_4_;
                auVar64 = vpermt2q_avx512vl(auVar62,auVar70,auVar63);
                local_27d0 = auVar64._0_8_;
                iVar43 = 0;
                uVar53 = local_2788 - 1 & local_2788;
                if (uVar53 != 0) {
                  auVar64 = vpshufd_avx2(auVar70,0x55);
                  vpermt2q_avx512vl(auVar62,auVar64,auVar63);
                  auVar65 = vpminsd_avx2(auVar70,auVar64);
                  auVar64 = vpmaxsd_avx2(auVar70,auVar64);
                  uVar53 = uVar53 - 1 & uVar53;
                  if (uVar53 == 0) {
                    auVar65 = vpermi2q_avx512vl(auVar65,auVar62,auVar63);
                    local_27d0 = auVar65._0_8_;
                    auVar62 = vpermt2q_avx512vl(auVar62,auVar64,auVar63);
                    *local_27c0 = auVar62._0_8_;
                    auVar62 = vpermd_avx2(auVar64,local_26a0);
                    *(int *)(local_27c0 + 1) = auVar62._0_4_;
                    local_27c0 = local_27c0 + 2;
                  }
                  else {
                    auVar67 = vpshufd_avx2(auVar70,0xaa);
                    vpermt2q_avx512vl(auVar62,auVar67,auVar63);
                    auVar66 = vpminsd_avx2(auVar65,auVar67);
                    auVar65 = vpmaxsd_avx2(auVar65,auVar67);
                    auVar67 = vpminsd_avx2(auVar64,auVar65);
                    auVar64 = vpmaxsd_avx2(auVar64,auVar65);
                    uVar53 = uVar53 - 1 & uVar53;
                    if (uVar53 == 0) {
                      auVar65 = vpermi2q_avx512vl(auVar66,auVar62,auVar63);
                      local_27d0 = auVar65._0_8_;
                      auVar65 = vpermt2q_avx512vl(auVar62,auVar64,auVar63);
                      *local_27c0 = auVar65._0_8_;
                      auVar64 = vpermd_avx2(auVar64,local_26a0);
                      *(int *)(local_27c0 + 1) = auVar64._0_4_;
                      auVar62 = vpermt2q_avx512vl(auVar62,auVar67,auVar63);
                      local_27c0[2] = auVar62._0_8_;
                      auVar62 = vpermd_avx2(auVar67,local_26a0);
                      *(int *)(local_27c0 + 3) = auVar62._0_4_;
                      local_27c0 = local_27c0 + 4;
                    }
                    else {
                      auVar65 = vpshufd_avx2(auVar70,0xff);
                      vpermt2q_avx512vl(auVar62,auVar65,auVar63);
                      auVar68 = vpminsd_avx2(auVar66,auVar65);
                      auVar65 = vpmaxsd_avx2(auVar66,auVar65);
                      auVar66 = vpminsd_avx2(auVar67,auVar65);
                      auVar65 = vpmaxsd_avx2(auVar67,auVar65);
                      auVar67 = vpminsd_avx2(auVar64,auVar65);
                      auVar64 = vpmaxsd_avx2(auVar64,auVar65);
                      uVar53 = uVar53 - 1 & uVar53;
                      if (uVar53 == 0) {
                        auVar65 = vpermi2q_avx512vl(auVar68,auVar62,auVar63);
                        local_27d0 = auVar65._0_8_;
                        auVar65 = vpermt2q_avx512vl(auVar62,auVar64,auVar63);
                        *local_27c0 = auVar65._0_8_;
                        auVar64 = vpermd_avx2(auVar64,local_26a0);
                        *(int *)(local_27c0 + 1) = auVar64._0_4_;
                        auVar64 = vpermt2q_avx512vl(auVar62,auVar67,auVar63);
                        local_27c0[2] = auVar64._0_8_;
                        auVar64 = vpermd_avx2(auVar67,local_26a0);
                        *(int *)(local_27c0 + 3) = auVar64._0_4_;
                        auVar62 = vpermt2q_avx512vl(auVar62,auVar66,auVar63);
                        local_27c0[4] = auVar62._0_8_;
                        auVar62 = vpermd_avx2(auVar66,local_26a0);
                        *(int *)(local_27c0 + 5) = auVar62._0_4_;
                        local_27c0 = local_27c0 + 6;
                      }
                      else {
                        auVar69 = valignd_avx512vl(auVar70,auVar70,3);
                        auVar65 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                        auVar68 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar65,auVar68);
                        auVar65 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar66 = vpermt2d_avx512vl(auVar68,auVar65,auVar66);
                        auVar66 = vpermt2d_avx512vl(auVar66,auVar65,auVar67);
                        auVar65 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar64 = vpermt2d_avx512vl(auVar66,auVar65,auVar64);
                        auVar111 = ZEXT3264(auVar64);
                        uVar48 = uVar53;
                        do {
                          auVar65 = auVar111._0_32_;
                          auVar72._8_4_ = 1;
                          auVar72._0_8_ = 0x100000001;
                          auVar72._12_4_ = 1;
                          auVar72._16_4_ = 1;
                          auVar72._20_4_ = 1;
                          auVar72._24_4_ = 1;
                          auVar72._28_4_ = 1;
                          auVar64 = vpermd_avx2(auVar72,auVar69);
                          auVar69 = valignd_avx512vl(auVar69,auVar69,1);
                          vpermt2q_avx512vl(auVar62,auVar69,auVar63);
                          uVar48 = uVar48 - 1 & uVar48;
                          uVar22 = vpcmpd_avx512vl(auVar64,auVar65,5);
                          auVar64 = vpmaxsd_avx2(auVar64,auVar65);
                          bVar41 = (byte)uVar22 << 1;
                          auVar65 = valignd_avx512vl(auVar65,auVar65,7);
                          bVar20 = (bool)((byte)uVar22 & 1);
                          auVar71._4_4_ =
                               (uint)bVar20 * auVar65._4_4_ | (uint)!bVar20 * auVar64._4_4_;
                          auVar71._0_4_ = auVar64._0_4_;
                          bVar20 = (bool)(bVar41 >> 2 & 1);
                          auVar71._8_4_ =
                               (uint)bVar20 * auVar65._8_4_ | (uint)!bVar20 * auVar64._8_4_;
                          bVar20 = (bool)(bVar41 >> 3 & 1);
                          auVar71._12_4_ =
                               (uint)bVar20 * auVar65._12_4_ | (uint)!bVar20 * auVar64._12_4_;
                          bVar20 = (bool)(bVar41 >> 4 & 1);
                          auVar71._16_4_ =
                               (uint)bVar20 * auVar65._16_4_ | (uint)!bVar20 * auVar64._16_4_;
                          bVar20 = (bool)(bVar41 >> 5 & 1);
                          auVar71._20_4_ =
                               (uint)bVar20 * auVar65._20_4_ | (uint)!bVar20 * auVar64._20_4_;
                          bVar20 = (bool)(bVar41 >> 6 & 1);
                          auVar71._24_4_ =
                               (uint)bVar20 * auVar65._24_4_ | (uint)!bVar20 * auVar64._24_4_;
                          auVar71._28_4_ =
                               (uint)(bVar41 >> 7) * auVar65._28_4_ |
                               (uint)!(bool)(bVar41 >> 7) * auVar64._28_4_;
                          auVar111 = ZEXT3264(auVar71);
                        } while (uVar48 != 0);
                        lVar44 = POPCOUNT(uVar53) + 3;
                        do {
                          auVar64 = vpermi2q_avx512vl(auVar71,auVar62,auVar63);
                          *local_27c0 = auVar64._0_8_;
                          auVar65 = auVar111._0_32_;
                          auVar64 = vpermd_avx2(auVar65,local_26a0);
                          *(int *)(local_27c0 + 1) = auVar64._0_4_;
                          auVar71 = valignd_avx512vl(auVar65,auVar65,1);
                          local_27c0 = local_27c0 + 2;
                          auVar111 = ZEXT3264(auVar71);
                          lVar44 = lVar44 + -1;
                        } while (lVar44 != 0);
                        auVar62 = vpermt2q_avx512vl(auVar62,auVar71,auVar63);
                        local_27d0 = auVar62._0_8_;
                      }
                      auVar127 = ZEXT3264(local_2600);
                      auVar128 = ZEXT3264(local_2620);
                      auVar129 = ZEXT3264(local_2640);
                      auVar130 = ZEXT3264(local_2660);
                      auVar131 = ZEXT3264(local_2680);
                      auVar116 = ZEXT3264(auVar116._0_32_);
                    }
                    auVar113 = ZEXT3264(auVar113._0_32_);
                    auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                    auVar114 = ZEXT3264(auVar62);
                  }
                  auVar111 = ZEXT3264(CONCAT428(0xfffffff8,
                                                CONCAT424(0xfffffff8,
                                                          CONCAT420(0xfffffff8,
                                                                    CONCAT416(0xfffffff8,
                                                                              CONCAT412(0xfffffff8,
                                                                                        CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
                }
              }
            }
            else {
              iVar43 = 6;
            }
          } while (iVar43 == 0);
        } while (iVar43 != 6);
        local_2750 = (ulong)((uint)local_27d0 & 0xf) - 8;
        if (local_2750 != 0) {
          local_27d0 = local_27d0 & 0xfffffffffffffff0;
          local_2718 = 0;
          do {
            lVar44 = local_2718 * 0x90;
            local_2710 = local_27d0 + lVar44;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = *(ulong *)(local_27d0 + 0x40 + lVar44);
            auVar100._8_8_ = 0;
            auVar100._0_8_ = *(ulong *)(local_27d0 + 0x48 + lVar44);
            uVar24 = vpcmpub_avx512vl(auVar96,auVar100,2);
            uVar95 = *(undefined4 *)(local_27d0 + 0x70 + lVar44);
            auVar79._4_4_ = uVar95;
            auVar79._0_4_ = uVar95;
            auVar79._8_4_ = uVar95;
            auVar79._12_4_ = uVar95;
            auVar79._16_4_ = uVar95;
            auVar79._20_4_ = uVar95;
            auVar79._24_4_ = uVar95;
            auVar79._28_4_ = uVar95;
            uVar95 = *(undefined4 *)(local_27d0 + 0x7c + lVar44);
            auVar82._4_4_ = uVar95;
            auVar82._0_4_ = uVar95;
            auVar82._8_4_ = uVar95;
            auVar82._12_4_ = uVar95;
            auVar82._16_4_ = uVar95;
            auVar82._20_4_ = uVar95;
            auVar82._24_4_ = uVar95;
            auVar82._28_4_ = uVar95;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = *(ulong *)(local_2758 + 0x40 + local_2710);
            auVar62 = vpmovzxbd_avx2(auVar61);
            auVar62 = vcvtdq2ps_avx(auVar62);
            auVar56 = vfmadd213ps_fma(auVar62,auVar82,auVar79);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = *(ulong *)(local_2760 + 0x40 + local_2710);
            auVar62 = vpmovzxbd_avx2(auVar21);
            auVar62 = vcvtdq2ps_avx(auVar62);
            auVar61 = vfmadd213ps_fma(auVar62,auVar82,auVar79);
            uVar95 = *(undefined4 *)(local_27d0 + 0x74 + lVar44);
            auVar80._4_4_ = uVar95;
            auVar80._0_4_ = uVar95;
            auVar80._8_4_ = uVar95;
            auVar80._12_4_ = uVar95;
            auVar80._16_4_ = uVar95;
            auVar80._20_4_ = uVar95;
            auVar80._24_4_ = uVar95;
            auVar80._28_4_ = uVar95;
            uVar95 = *(undefined4 *)(local_27d0 + 0x80 + lVar44);
            auVar83._4_4_ = uVar95;
            auVar83._0_4_ = uVar95;
            auVar83._8_4_ = uVar95;
            auVar83._12_4_ = uVar95;
            auVar83._16_4_ = uVar95;
            auVar83._20_4_ = uVar95;
            auVar83._24_4_ = uVar95;
            auVar83._28_4_ = uVar95;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)(local_2768 + 0x40 + local_2710);
            auVar62 = vpmovzxbd_avx2(auVar9);
            auVar62 = vcvtdq2ps_avx(auVar62);
            auVar21 = vfmadd213ps_fma(auVar62,auVar83,auVar80);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)(local_2770 + 0x40 + local_2710);
            auVar62 = vpmovzxbd_avx2(auVar10);
            auVar62 = vcvtdq2ps_avx(auVar62);
            auVar57 = vfmadd213ps_fma(auVar62,auVar83,auVar80);
            uVar95 = *(undefined4 *)(local_27d0 + 0x78 + lVar44);
            auVar81._4_4_ = uVar95;
            auVar81._0_4_ = uVar95;
            auVar81._8_4_ = uVar95;
            auVar81._12_4_ = uVar95;
            auVar81._16_4_ = uVar95;
            auVar81._20_4_ = uVar95;
            auVar81._24_4_ = uVar95;
            auVar81._28_4_ = uVar95;
            uVar95 = *(undefined4 *)(local_27d0 + 0x84 + lVar44);
            auVar84._4_4_ = uVar95;
            auVar84._0_4_ = uVar95;
            auVar84._8_4_ = uVar95;
            auVar84._12_4_ = uVar95;
            auVar84._16_4_ = uVar95;
            auVar84._20_4_ = uVar95;
            auVar84._24_4_ = uVar95;
            auVar84._28_4_ = uVar95;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(local_2778 + 0x40 + local_2710);
            auVar62 = vpmovzxbd_avx2(auVar11);
            auVar62 = vcvtdq2ps_avx(auVar62);
            auVar59 = vfmadd213ps_fma(auVar62,auVar84,auVar81);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)(local_2780 + 0x40 + local_2710);
            auVar62 = vpmovzxbd_avx2(auVar12);
            auVar62 = vcvtdq2ps_avx(auVar62);
            auVar60 = vfmadd213ps_fma(auVar62,auVar84,auVar81);
            auVar62 = vsubps_avx512vl(ZEXT1632(auVar56),auVar127._0_32_);
            auVar62 = vmulps_avx512vl(auVar130._0_32_,auVar62);
            auVar63 = vsubps_avx512vl(ZEXT1632(auVar21),auVar128._0_32_);
            auVar63 = vmulps_avx512vl(auVar131._0_32_,auVar63);
            auVar62 = vmaxps_avx(auVar62,auVar63);
            auVar63 = vsubps_avx512vl(ZEXT1632(auVar59),auVar129._0_32_);
            auVar73._4_4_ = auVar63._4_4_ * (float)local_2580._4_4_;
            auVar73._0_4_ = auVar63._0_4_ * (float)local_2580._0_4_;
            auVar73._8_4_ = auVar63._8_4_ * fStack_2578;
            auVar73._12_4_ = auVar63._12_4_ * fStack_2574;
            auVar73._16_4_ = auVar63._16_4_ * fStack_2570;
            auVar73._20_4_ = auVar63._20_4_ * fStack_256c;
            auVar73._24_4_ = auVar63._24_4_ * fStack_2568;
            auVar73._28_4_ = auVar63._28_4_;
            auVar63 = vsubps_avx512vl(ZEXT1632(auVar61),auVar127._0_32_);
            auVar74._4_4_ = auVar63._4_4_ * (float)local_25a0._4_4_;
            auVar74._0_4_ = auVar63._0_4_ * (float)local_25a0._0_4_;
            auVar74._8_4_ = auVar63._8_4_ * fStack_2598;
            auVar74._12_4_ = auVar63._12_4_ * fStack_2594;
            auVar74._16_4_ = auVar63._16_4_ * fStack_2590;
            auVar74._20_4_ = auVar63._20_4_ * fStack_258c;
            auVar74._24_4_ = auVar63._24_4_ * fStack_2588;
            auVar74._28_4_ = auVar63._28_4_;
            auVar63 = vsubps_avx512vl(ZEXT1632(auVar57),auVar128._0_32_);
            auVar75._4_4_ = auVar63._4_4_ * (float)local_2520._4_4_;
            auVar75._0_4_ = auVar63._0_4_ * (float)local_2520._0_4_;
            auVar75._8_4_ = auVar63._8_4_ * fStack_2518;
            auVar75._12_4_ = auVar63._12_4_ * fStack_2514;
            auVar75._16_4_ = auVar63._16_4_ * fStack_2510;
            auVar75._20_4_ = auVar63._20_4_ * fStack_250c;
            auVar75._24_4_ = auVar63._24_4_ * fStack_2508;
            auVar75._28_4_ = auVar63._28_4_;
            auVar64 = vminps_avx(auVar74,auVar75);
            auVar63 = vsubps_avx512vl(ZEXT1632(auVar60),auVar129._0_32_);
            auVar76._4_4_ = auVar63._4_4_ * (float)local_2540._4_4_;
            auVar76._0_4_ = auVar63._0_4_ * (float)local_2540._0_4_;
            auVar76._8_4_ = auVar63._8_4_ * fStack_2538;
            auVar76._12_4_ = auVar63._12_4_ * fStack_2534;
            auVar76._16_4_ = auVar63._16_4_ * fStack_2530;
            auVar76._20_4_ = auVar63._20_4_ * fStack_252c;
            auVar76._24_4_ = auVar63._24_4_ * fStack_2528;
            auVar76._28_4_ = auVar63._28_4_;
            auVar78._4_4_ = uStack_255c;
            auVar78._0_4_ = local_2560;
            auVar78._8_4_ = uStack_2558;
            auVar78._12_4_ = uStack_2554;
            auVar78._16_4_ = uStack_2550;
            auVar78._20_4_ = uStack_254c;
            auVar78._24_4_ = uStack_2548;
            auVar78._28_4_ = uStack_2544;
            auVar63 = vmaxps_avx(auVar73,auVar78);
            local_23c0 = vmaxps_avx(auVar62,auVar63);
            auVar77._4_4_ = fStack_25dc;
            auVar77._0_4_ = local_25e0;
            auVar77._8_4_ = fStack_25d8;
            auVar77._12_4_ = fStack_25d4;
            auVar77._16_4_ = fStack_25d0;
            auVar77._20_4_ = fStack_25cc;
            auVar77._24_4_ = fStack_25c8;
            auVar77._28_4_ = fStack_25c4;
            auVar62 = vminps_avx(auVar76,auVar77);
            auVar62 = vminps_avx(auVar64,auVar62);
            uVar22 = vcmpps_avx512vl(local_23c0,auVar62,2);
            if ((byte)((byte)uVar22 & (byte)uVar24) != 0) {
              local_2708 = (ulong)(byte)((byte)uVar22 & (byte)uVar24);
              do {
                lVar44 = 0;
                for (uVar53 = local_2708; (uVar53 & 1) == 0;
                    uVar53 = uVar53 >> 1 | 0x8000000000000000) {
                  lVar44 = lVar44 + 1;
                }
                fVar106 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_23c0 + lVar44 * 4) <= fVar106) {
                  uVar13 = *(ushort *)(local_2710 + lVar44 * 8);
                  uVar14 = *(ushort *)(local_2710 + 2 + lVar44 * 8);
                  uVar54 = *(uint *)(local_2710 + 0x88);
                  uVar53 = (ulong)uVar54;
                  uVar15 = *(uint *)(local_2710 + 4 + lVar44 * 8);
                  local_27a8 = context->scene;
                  pGVar16 = (local_27a8->geometries).items[uVar53].ptr;
                  lVar44 = *(long *)&pGVar16->field_0x58;
                  local_2790 = (ulong)uVar15;
                  lVar49 = pGVar16[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar15;
                  uVar47 = *(uint *)(lVar44 + 4 + lVar49);
                  uVar52 = (ulong)uVar47;
                  uVar46 = (ulong)(uVar47 * (uVar14 & 0x7fff) +
                                  *(int *)(lVar44 + lVar49) + (uVar13 & 0x7fff));
                  lVar17 = *(long *)&pGVar16[1].time_range.upper;
                  p_Var18 = pGVar16[1].intersectionFilterN;
                  auVar56 = *(undefined1 (*) [16])(lVar17 + (uVar46 + 1) * (long)p_Var18);
                  auVar61 = *(undefined1 (*) [16])(lVar17 + (uVar46 + uVar52) * (long)p_Var18);
                  lVar51 = uVar46 + uVar52 + 1;
                  auVar21 = *(undefined1 (*) [16])(lVar17 + lVar51 * (long)p_Var18);
                  uVar48 = (ulong)(-1 < (short)uVar13);
                  auVar57 = *(undefined1 (*) [16])(lVar17 + (uVar46 + uVar48 + 1) * (long)p_Var18);
                  lVar45 = uVar48 + lVar51;
                  auVar59 = *(undefined1 (*) [16])(lVar17 + lVar45 * (long)p_Var18);
                  uVar48 = 0;
                  if (-1 < (short)uVar14) {
                    uVar48 = uVar52;
                  }
                  auVar60 = *(undefined1 (*) [16])
                             (lVar17 + (uVar46 + uVar52 + uVar48) * (long)p_Var18);
                  auVar58 = *(undefined1 (*) [16])(lVar17 + (lVar51 + uVar48) * (long)p_Var18);
                  auVar117._16_16_ =
                       *(undefined1 (*) [16])(lVar17 + (uVar48 + lVar45) * (long)p_Var18);
                  auVar117._0_16_ = auVar21;
                  auVar9 = vunpcklps_avx(auVar56,auVar59);
                  auVar109 = vunpckhps_avx(auVar56,auVar59);
                  auVar10 = vunpcklps_avx(auVar57,auVar21);
                  auVar57 = vunpckhps_avx(auVar57,auVar21);
                  auVar11 = vunpcklps_avx(auVar109,auVar57);
                  auVar12 = vunpcklps_avx(auVar9,auVar10);
                  auVar57 = vunpckhps_avx(auVar9,auVar10);
                  auVar9 = vunpcklps_avx(auVar61,auVar58);
                  auVar109 = vunpckhps_avx(auVar61,auVar58);
                  auVar10 = vunpcklps_avx(auVar21,auVar60);
                  auVar60 = vunpckhps_avx(auVar21,auVar60);
                  auVar109 = vunpcklps_avx(auVar109,auVar60);
                  auVar96 = vunpcklps_avx(auVar9,auVar10);
                  auVar60 = vunpckhps_avx(auVar9,auVar10);
                  auVar107._16_16_ = auVar58;
                  auVar107._0_16_ = auVar61;
                  auVar104._16_16_ = auVar59;
                  auVar104._0_16_ = auVar56;
                  auVar62 = vunpcklps_avx(auVar104,auVar107);
                  auVar101._16_16_ = auVar21;
                  auVar101._0_16_ = *(undefined1 (*) [16])(lVar17 + (long)p_Var18 * uVar46);
                  auVar63 = vunpcklps_avx(auVar101,auVar117);
                  auVar65 = vunpcklps_avx(auVar63,auVar62);
                  auVar63 = vunpckhps_avx(auVar63,auVar62);
                  auVar62 = vunpckhps_avx(auVar104,auVar107);
                  auVar64 = vunpckhps_avx(auVar101,auVar117);
                  auVar64 = vunpcklps_avx(auVar64,auVar62);
                  auVar105._16_16_ = auVar12;
                  auVar105._0_16_ = auVar12;
                  auVar108._16_16_ = auVar57;
                  auVar108._0_16_ = auVar57;
                  auVar112._16_16_ = auVar11;
                  auVar112._0_16_ = auVar11;
                  auVar120._16_16_ = auVar96;
                  auVar120._0_16_ = auVar96;
                  auVar123._16_16_ = auVar60;
                  auVar123._0_16_ = auVar60;
                  auVar124._16_16_ = auVar109;
                  auVar124._0_16_ = auVar109;
                  uVar95 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
                  auVar126._4_4_ = uVar95;
                  auVar126._0_4_ = uVar95;
                  auVar126._8_4_ = uVar95;
                  auVar126._12_4_ = uVar95;
                  auVar126._16_4_ = uVar95;
                  auVar126._20_4_ = uVar95;
                  auVar126._24_4_ = uVar95;
                  auVar126._28_4_ = uVar95;
                  auVar66 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
                  auVar67 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
                  uVar95 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
                  auVar115._4_4_ = uVar95;
                  auVar115._0_4_ = uVar95;
                  auVar115._8_4_ = uVar95;
                  auVar115._12_4_ = uVar95;
                  auVar115._16_4_ = uVar95;
                  auVar115._20_4_ = uVar95;
                  auVar115._24_4_ = uVar95;
                  auVar115._28_4_ = uVar95;
                  local_24a0 = &local_27c1;
                  uVar95 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
                  auVar118._4_4_ = uVar95;
                  auVar118._0_4_ = uVar95;
                  auVar118._8_4_ = uVar95;
                  auVar118._12_4_ = uVar95;
                  auVar118._16_4_ = uVar95;
                  auVar118._20_4_ = uVar95;
                  auVar118._24_4_ = uVar95;
                  auVar118._28_4_ = uVar95;
                  fVar103 = (ray->super_RayK<1>).dir.field_0.m128[2];
                  auVar122._4_4_ = fVar103;
                  auVar122._0_4_ = fVar103;
                  auVar122._8_4_ = fVar103;
                  auVar122._12_4_ = fVar103;
                  auVar122._16_4_ = fVar103;
                  auVar122._20_4_ = fVar103;
                  auVar122._24_4_ = fVar103;
                  auVar122._28_4_ = fVar103;
                  auVar62 = vsubps_avx(auVar65,auVar126);
                  auVar65 = vsubps_avx512vl(auVar63,auVar66);
                  auVar64 = vsubps_avx512vl(auVar64,auVar67);
                  auVar63 = vsubps_avx(auVar105,auVar126);
                  auVar68 = vsubps_avx512vl(auVar108,auVar66);
                  auVar69 = vsubps_avx512vl(auVar112,auVar67);
                  auVar70 = vsubps_avx512vl(auVar120,auVar126);
                  auVar66 = vsubps_avx512vl(auVar123,auVar66);
                  auVar67 = vsubps_avx512vl(auVar124,auVar67);
                  auVar71 = vsubps_avx512vl(auVar70,auVar62);
                  auVar72 = vsubps_avx512vl(auVar66,auVar65);
                  auVar73 = vsubps_avx512vl(auVar67,auVar64);
                  auVar74 = vsubps_avx512vl(auVar62,auVar63);
                  auVar75 = vsubps_avx512vl(auVar65,auVar68);
                  auVar76 = vsubps_avx512vl(auVar64,auVar69);
                  auVar77 = vsubps_avx512vl(auVar63,auVar70);
                  auVar78 = vsubps_avx512vl(auVar68,auVar66);
                  auVar79 = vsubps_avx512vl(auVar69,auVar67);
                  auVar80 = vaddps_avx512vl(auVar70,auVar62);
                  auVar81 = vaddps_avx512vl(auVar66,auVar65);
                  auVar82 = vaddps_avx512vl(auVar67,auVar64);
                  auVar83 = vmulps_avx512vl(auVar81,auVar73);
                  auVar83 = vfmsub231ps_avx512vl(auVar83,auVar72,auVar82);
                  auVar82 = vmulps_avx512vl(auVar82,auVar71);
                  auVar82 = vfmsub231ps_avx512vl(auVar82,auVar73,auVar80);
                  auVar80 = vmulps_avx512vl(auVar80,auVar72);
                  auVar56 = vfmsub231ps_fma(auVar80,auVar71,auVar81);
                  auVar121._0_4_ = fVar103 * auVar56._0_4_;
                  auVar121._4_4_ = fVar103 * auVar56._4_4_;
                  auVar121._8_4_ = fVar103 * auVar56._8_4_;
                  auVar121._12_4_ = fVar103 * auVar56._12_4_;
                  auVar121._16_4_ = fVar103 * 0.0;
                  auVar121._20_4_ = fVar103 * 0.0;
                  auVar121._24_4_ = fVar103 * 0.0;
                  auVar121._28_4_ = 0;
                  auVar80 = vfmadd231ps_avx512vl(auVar121,auVar118,auVar82);
                  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar115,auVar83);
                  auVar125._0_4_ = auVar62._0_4_ + auVar63._0_4_;
                  auVar125._4_4_ = auVar62._4_4_ + auVar63._4_4_;
                  auVar125._8_4_ = auVar62._8_4_ + auVar63._8_4_;
                  auVar125._12_4_ = auVar62._12_4_ + auVar63._12_4_;
                  auVar125._16_4_ = auVar62._16_4_ + auVar63._16_4_;
                  auVar125._20_4_ = auVar62._20_4_ + auVar63._20_4_;
                  auVar125._24_4_ = auVar62._24_4_ + auVar63._24_4_;
                  auVar125._28_4_ = auVar62._28_4_ + auVar63._28_4_;
                  auVar81 = vaddps_avx512vl(auVar65,auVar68);
                  auVar82 = vaddps_avx512vl(auVar64,auVar69);
                  auVar83 = vmulps_avx512vl(auVar81,auVar76);
                  auVar83 = vfmsub231ps_avx512vl(auVar83,auVar75,auVar82);
                  auVar82 = vmulps_avx512vl(auVar82,auVar74);
                  auVar82 = vfmsub231ps_avx512vl(auVar82,auVar76,auVar125);
                  auVar84 = vmulps_avx512vl(auVar125,auVar75);
                  auVar81 = vfmsub231ps_avx512vl(auVar84,auVar74,auVar81);
                  auVar34._4_4_ = fVar103 * auVar81._4_4_;
                  auVar34._0_4_ = fVar103 * auVar81._0_4_;
                  auVar34._8_4_ = fVar103 * auVar81._8_4_;
                  auVar34._12_4_ = fVar103 * auVar81._12_4_;
                  auVar34._16_4_ = fVar103 * auVar81._16_4_;
                  auVar34._20_4_ = fVar103 * auVar81._20_4_;
                  auVar34._24_4_ = fVar103 * auVar81._24_4_;
                  auVar34._28_4_ = auVar81._28_4_;
                  auVar81 = vfmadd231ps_avx512vl(auVar34,auVar118,auVar82);
                  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar115,auVar83);
                  auVar63 = vaddps_avx512vl(auVar63,auVar70);
                  auVar66 = vaddps_avx512vl(auVar68,auVar66);
                  auVar67 = vaddps_avx512vl(auVar69,auVar67);
                  auVar68 = vmulps_avx512vl(auVar66,auVar79);
                  auVar68 = vfmsub231ps_avx512vl(auVar68,auVar78,auVar67);
                  auVar35._4_4_ = auVar67._4_4_ * auVar77._4_4_;
                  auVar35._0_4_ = auVar67._0_4_ * auVar77._0_4_;
                  auVar35._8_4_ = auVar67._8_4_ * auVar77._8_4_;
                  auVar35._12_4_ = auVar67._12_4_ * auVar77._12_4_;
                  auVar35._16_4_ = auVar67._16_4_ * auVar77._16_4_;
                  auVar35._20_4_ = auVar67._20_4_ * auVar77._20_4_;
                  auVar35._24_4_ = auVar67._24_4_ * auVar77._24_4_;
                  auVar35._28_4_ = auVar67._28_4_;
                  auVar56 = vfmsub231ps_fma(auVar35,auVar79,auVar63);
                  auVar36._4_4_ = auVar63._4_4_ * auVar78._4_4_;
                  auVar36._0_4_ = auVar63._0_4_ * auVar78._0_4_;
                  auVar36._8_4_ = auVar63._8_4_ * auVar78._8_4_;
                  auVar36._12_4_ = auVar63._12_4_ * auVar78._12_4_;
                  auVar36._16_4_ = auVar63._16_4_ * auVar78._16_4_;
                  auVar36._20_4_ = auVar63._20_4_ * auVar78._20_4_;
                  auVar36._24_4_ = auVar63._24_4_ * auVar78._24_4_;
                  auVar36._28_4_ = auVar63._28_4_;
                  auVar63 = vfmsub231ps_avx512vl(auVar36,auVar77,auVar66);
                  auVar63 = vmulps_avx512vl(auVar122,auVar63);
                  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar118,ZEXT1632(auVar56));
                  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar115,auVar68);
                  auVar102._0_4_ = auVar80._0_4_ + auVar81._0_4_;
                  auVar102._4_4_ = auVar80._4_4_ + auVar81._4_4_;
                  auVar102._8_4_ = auVar80._8_4_ + auVar81._8_4_;
                  auVar102._12_4_ = auVar80._12_4_ + auVar81._12_4_;
                  auVar102._16_4_ = auVar80._16_4_ + auVar81._16_4_;
                  auVar102._20_4_ = auVar80._20_4_ + auVar81._20_4_;
                  auVar102._24_4_ = auVar80._24_4_ + auVar81._24_4_;
                  auVar102._28_4_ = auVar80._28_4_ + auVar81._28_4_;
                  local_24c0 = vaddps_avx512vl(auVar63,auVar102);
                  auVar26._8_4_ = 0x7fffffff;
                  auVar26._0_8_ = 0x7fffffff7fffffff;
                  auVar26._12_4_ = 0x7fffffff;
                  auVar26._16_4_ = 0x7fffffff;
                  auVar26._20_4_ = 0x7fffffff;
                  auVar26._24_4_ = 0x7fffffff;
                  auVar26._28_4_ = 0x7fffffff;
                  vandps_avx512vl(local_24c0,auVar26);
                  auVar27._8_4_ = 0x34000000;
                  auVar27._0_8_ = 0x3400000034000000;
                  auVar27._12_4_ = 0x34000000;
                  auVar27._16_4_ = 0x34000000;
                  auVar27._20_4_ = 0x34000000;
                  auVar27._24_4_ = 0x34000000;
                  auVar27._28_4_ = 0x34000000;
                  auVar66 = vmulps_avx512vl(local_24c0,auVar27);
                  auVar67 = vminps_avx512vl(auVar80,auVar81);
                  auVar67 = vminps_avx512vl(auVar67,auVar63);
                  auVar28._8_4_ = 0x80000000;
                  auVar28._0_8_ = 0x8000000080000000;
                  auVar28._12_4_ = 0x80000000;
                  auVar28._16_4_ = 0x80000000;
                  auVar28._20_4_ = 0x80000000;
                  auVar28._24_4_ = 0x80000000;
                  auVar28._28_4_ = 0x80000000;
                  auVar68 = vxorps_avx512vl(auVar66,auVar28);
                  uVar22 = vcmpps_avx512vl(auVar67,auVar68,5);
                  auVar67 = vmaxps_avx512vl(auVar80,auVar81);
                  auVar63 = vmaxps_avx512vl(auVar67,auVar63);
                  uVar24 = vcmpps_avx512vl(auVar63,auVar66,2);
                  bVar41 = (byte)uVar22 | (byte)uVar24;
                  if (bVar41 != 0) {
                    auVar63 = vmulps_avx512vl(auVar73,auVar75);
                    auVar66 = vmulps_avx512vl(auVar71,auVar76);
                    auVar67 = vmulps_avx512vl(auVar72,auVar74);
                    auVar68 = vmulps_avx512vl(auVar76,auVar78);
                    auVar69 = vmulps_avx512vl(auVar74,auVar79);
                    auVar70 = vmulps_avx512vl(auVar75,auVar77);
                    auVar72 = vfmsub213ps_avx512vl(auVar72,auVar76,auVar63);
                    auVar73 = vfmsub213ps_avx512vl(auVar73,auVar74,auVar66);
                    auVar71 = vfmsub213ps_avx512vl(auVar71,auVar75,auVar67);
                    auVar75 = vfmsub213ps_avx512vl(auVar79,auVar75,auVar68);
                    auVar76 = vfmsub213ps_avx512vl(auVar77,auVar76,auVar69);
                    auVar74 = vfmsub213ps_avx512vl(auVar78,auVar74,auVar70);
                    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    vandps_avx512vl(auVar63,auVar77);
                    vandps_avx512vl(auVar68,auVar77);
                    uVar48 = vcmpps_avx512vl(auVar77,auVar77,1);
                    vandps_avx512vl(auVar66,auVar77);
                    vandps_avx512vl(auVar69,auVar77);
                    uVar46 = vcmpps_avx512vl(auVar77,auVar77,1);
                    vandps_avx512vl(auVar67,auVar77);
                    vandps_avx512vl(auVar70,auVar77);
                    uVar52 = vcmpps_avx512vl(auVar77,auVar77,1);
                    bVar20 = (bool)((byte)uVar48 & 1);
                    auVar85._0_4_ =
                         (float)((uint)bVar20 * auVar72._0_4_ | (uint)!bVar20 * auVar75._0_4_);
                    bVar20 = (bool)((byte)(uVar48 >> 1) & 1);
                    auVar85._4_4_ =
                         (float)((uint)bVar20 * auVar72._4_4_ | (uint)!bVar20 * auVar75._4_4_);
                    bVar20 = (bool)((byte)(uVar48 >> 2) & 1);
                    auVar85._8_4_ =
                         (float)((uint)bVar20 * auVar72._8_4_ | (uint)!bVar20 * auVar75._8_4_);
                    bVar20 = (bool)((byte)(uVar48 >> 3) & 1);
                    auVar85._12_4_ =
                         (float)((uint)bVar20 * auVar72._12_4_ | (uint)!bVar20 * auVar75._12_4_);
                    bVar20 = (bool)((byte)(uVar48 >> 4) & 1);
                    auVar85._16_4_ =
                         (float)((uint)bVar20 * auVar72._16_4_ | (uint)!bVar20 * auVar75._16_4_);
                    bVar20 = (bool)((byte)(uVar48 >> 5) & 1);
                    auVar85._20_4_ =
                         (float)((uint)bVar20 * auVar72._20_4_ | (uint)!bVar20 * auVar75._20_4_);
                    bVar20 = (bool)((byte)(uVar48 >> 6) & 1);
                    auVar85._24_4_ =
                         (float)((uint)bVar20 * auVar72._24_4_ | (uint)!bVar20 * auVar75._24_4_);
                    bVar20 = SUB81(uVar48 >> 7,0);
                    auVar85._28_4_ = (uint)bVar20 * auVar72._28_4_ | (uint)!bVar20 * auVar75._28_4_;
                    bVar20 = (bool)((byte)uVar46 & 1);
                    auVar86._0_4_ =
                         (float)((uint)bVar20 * auVar73._0_4_ | (uint)!bVar20 * auVar76._0_4_);
                    bVar20 = (bool)((byte)(uVar46 >> 1) & 1);
                    auVar86._4_4_ =
                         (float)((uint)bVar20 * auVar73._4_4_ | (uint)!bVar20 * auVar76._4_4_);
                    bVar20 = (bool)((byte)(uVar46 >> 2) & 1);
                    auVar86._8_4_ =
                         (float)((uint)bVar20 * auVar73._8_4_ | (uint)!bVar20 * auVar76._8_4_);
                    bVar20 = (bool)((byte)(uVar46 >> 3) & 1);
                    auVar86._12_4_ =
                         (float)((uint)bVar20 * auVar73._12_4_ | (uint)!bVar20 * auVar76._12_4_);
                    bVar20 = (bool)((byte)(uVar46 >> 4) & 1);
                    auVar86._16_4_ =
                         (float)((uint)bVar20 * auVar73._16_4_ | (uint)!bVar20 * auVar76._16_4_);
                    bVar20 = (bool)((byte)(uVar46 >> 5) & 1);
                    auVar86._20_4_ =
                         (float)((uint)bVar20 * auVar73._20_4_ | (uint)!bVar20 * auVar76._20_4_);
                    bVar20 = (bool)((byte)(uVar46 >> 6) & 1);
                    auVar86._24_4_ =
                         (float)((uint)bVar20 * auVar73._24_4_ | (uint)!bVar20 * auVar76._24_4_);
                    bVar20 = SUB81(uVar46 >> 7,0);
                    auVar86._28_4_ = (uint)bVar20 * auVar73._28_4_ | (uint)!bVar20 * auVar76._28_4_;
                    bVar20 = (bool)((byte)uVar52 & 1);
                    fVar55 = (float)((uint)bVar20 * auVar71._0_4_ | (uint)!bVar20 * auVar74._0_4_);
                    bVar20 = (bool)((byte)(uVar52 >> 1) & 1);
                    fVar89 = (float)((uint)bVar20 * auVar71._4_4_ | (uint)!bVar20 * auVar74._4_4_);
                    bVar20 = (bool)((byte)(uVar52 >> 2) & 1);
                    fVar90 = (float)((uint)bVar20 * auVar71._8_4_ | (uint)!bVar20 * auVar74._8_4_);
                    bVar20 = (bool)((byte)(uVar52 >> 3) & 1);
                    fVar91 = (float)((uint)bVar20 * auVar71._12_4_ | (uint)!bVar20 * auVar74._12_4_)
                    ;
                    bVar20 = (bool)((byte)(uVar52 >> 4) & 1);
                    fVar92 = (float)((uint)bVar20 * auVar71._16_4_ | (uint)!bVar20 * auVar74._16_4_)
                    ;
                    bVar20 = (bool)((byte)(uVar52 >> 5) & 1);
                    fVar93 = (float)((uint)bVar20 * auVar71._20_4_ | (uint)!bVar20 * auVar74._20_4_)
                    ;
                    bVar20 = (bool)((byte)(uVar52 >> 6) & 1);
                    fVar94 = (float)((uint)bVar20 * auVar71._24_4_ | (uint)!bVar20 * auVar74._24_4_)
                    ;
                    bVar20 = SUB81(uVar52 >> 7,0);
                    auVar37._4_4_ = fVar103 * fVar89;
                    auVar37._0_4_ = fVar103 * fVar55;
                    auVar37._8_4_ = fVar103 * fVar90;
                    auVar37._12_4_ = fVar103 * fVar91;
                    auVar37._16_4_ = fVar103 * fVar92;
                    auVar37._20_4_ = fVar103 * fVar93;
                    auVar37._24_4_ = fVar103 * fVar94;
                    auVar37._28_4_ = fVar103;
                    auVar56 = vfmadd213ps_fma(auVar118,auVar86,auVar37);
                    auVar56 = vfmadd213ps_fma(auVar115,auVar85,ZEXT1632(auVar56));
                    auVar66 = ZEXT1632(CONCAT412(auVar56._12_4_ + auVar56._12_4_,
                                                 CONCAT48(auVar56._8_4_ + auVar56._8_4_,
                                                          CONCAT44(auVar56._4_4_ + auVar56._4_4_,
                                                                   auVar56._0_4_ + auVar56._0_4_))))
                    ;
                    auVar119._0_4_ = auVar64._0_4_ * fVar55;
                    auVar119._4_4_ = auVar64._4_4_ * fVar89;
                    auVar119._8_4_ = auVar64._8_4_ * fVar90;
                    auVar119._12_4_ = auVar64._12_4_ * fVar91;
                    auVar119._16_4_ = auVar64._16_4_ * fVar92;
                    auVar119._20_4_ = auVar64._20_4_ * fVar93;
                    auVar119._24_4_ = auVar64._24_4_ * fVar94;
                    auVar119._28_4_ = 0;
                    auVar56 = vfmadd213ps_fma(auVar65,auVar86,auVar119);
                    auVar61 = vfmadd213ps_fma(auVar62,auVar85,ZEXT1632(auVar56));
                    auVar62 = vrcp14ps_avx512vl(auVar66);
                    auVar29._8_4_ = 0x80000000;
                    auVar29._0_8_ = 0x8000000080000000;
                    auVar29._12_4_ = 0x80000000;
                    auVar29._16_4_ = 0x80000000;
                    auVar29._20_4_ = 0x80000000;
                    auVar29._24_4_ = 0x80000000;
                    auVar29._28_4_ = 0x80000000;
                    auVar63 = vxorps_avx512vl(auVar66,auVar29);
                    auVar30._8_4_ = 0x3f800000;
                    auVar30._0_8_ = &DAT_3f8000003f800000;
                    auVar30._12_4_ = 0x3f800000;
                    auVar30._16_4_ = 0x3f800000;
                    auVar30._20_4_ = 0x3f800000;
                    auVar30._24_4_ = 0x3f800000;
                    auVar30._28_4_ = 0x3f800000;
                    auVar64 = vfnmadd213ps_avx512vl(auVar62,auVar66,auVar30);
                    auVar56 = vfmadd132ps_fma(auVar64,auVar62,auVar62);
                    local_2440 = ZEXT1632(CONCAT412(auVar56._12_4_ *
                                                    (auVar61._12_4_ + auVar61._12_4_),
                                                    CONCAT48(auVar56._8_4_ *
                                                             (auVar61._8_4_ + auVar61._8_4_),
                                                             CONCAT44(auVar56._4_4_ *
                                                                      (auVar61._4_4_ + auVar61._4_4_
                                                                      ),auVar56._0_4_ *
                                                                        (auVar61._0_4_ +
                                                                        auVar61._0_4_)))));
                    auVar97._4_4_ = fVar106;
                    auVar97._0_4_ = fVar106;
                    auVar97._8_4_ = fVar106;
                    auVar97._12_4_ = fVar106;
                    auVar97._16_4_ = fVar106;
                    auVar97._20_4_ = fVar106;
                    auVar97._24_4_ = fVar106;
                    auVar97._28_4_ = fVar106;
                    uVar22 = vcmpps_avx512vl(local_2440,auVar97,2);
                    uVar95 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
                    auVar31._4_4_ = uVar95;
                    auVar31._0_4_ = uVar95;
                    auVar31._8_4_ = uVar95;
                    auVar31._12_4_ = uVar95;
                    auVar31._16_4_ = uVar95;
                    auVar31._20_4_ = uVar95;
                    auVar31._24_4_ = uVar95;
                    auVar31._28_4_ = uVar95;
                    uVar24 = vcmpps_avx512vl(local_2440,auVar31,0xd);
                    uVar23 = vcmpps_avx512vl(auVar66,auVar63,4);
                    bVar41 = (byte)uVar22 & (byte)uVar24 & (byte)uVar23 & bVar41;
                    if (bVar41 != 0) {
                      local_24a0 = &local_27c1;
                      local_2498 = CONCAT31(local_2498._1_3_,bVar41);
                      auVar62 = vsubps_avx(local_24c0,auVar81);
                      auVar62 = vblendps_avx(auVar80,auVar62,0xf0);
                      auVar63 = vsubps_avx(local_24c0,auVar80);
                      auVar63 = vblendps_avx(auVar81,auVar63,0xf0);
                      local_2420[0] = auVar85._0_4_ * 1.0;
                      local_2420[1] = auVar85._4_4_ * 1.0;
                      local_2420[2] = auVar85._8_4_ * 1.0;
                      local_2420[3] = auVar85._12_4_ * 1.0;
                      fStack_2410 = auVar85._16_4_ * -1.0;
                      fStack_240c = auVar85._20_4_ * -1.0;
                      fStack_2408 = auVar85._24_4_ * -1.0;
                      uStack_2404 = auVar85._28_4_;
                      local_2400[0] = auVar86._0_4_ * 1.0;
                      local_2400[1] = auVar86._4_4_ * 1.0;
                      local_2400[2] = auVar86._8_4_ * 1.0;
                      local_2400[3] = auVar86._12_4_ * 1.0;
                      fStack_23f0 = auVar86._16_4_ * -1.0;
                      fStack_23ec = auVar86._20_4_ * -1.0;
                      fStack_23e8 = auVar86._24_4_ * -1.0;
                      uStack_23e4 = auVar86._28_4_;
                      local_23e0[0] = fVar55 * 1.0;
                      local_23e0[1] = fVar89 * 1.0;
                      local_23e0[2] = fVar90 * 1.0;
                      local_23e0[3] = fVar91 * 1.0;
                      fStack_23d0 = fVar92 * -1.0;
                      fStack_23cc = fVar93 * -1.0;
                      fStack_23c8 = fVar94 * -1.0;
                      uStack_23c4 = (uint)bVar20 * auVar71._28_4_ | (uint)!bVar20 * auVar74._28_4_;
                      auVar64 = vpbroadcastd_avx512vl();
                      auVar64 = vpaddd_avx2(auVar64,_DAT_0205d4c0);
                      auVar65 = vpbroadcastd_avx512vl();
                      auVar65 = vpaddd_avx2(auVar65,_DAT_0205d4e0);
                      auVar56 = vcvtsi2ss_avx512f(auVar127._0_16_,
                                                  *(ushort *)(lVar44 + 8 + lVar49) - 1);
                      auVar40._12_4_ = 0;
                      auVar40._0_12_ = ZEXT812(0);
                      auVar61 = vrcp14ss_avx512f(auVar40 << 0x20,ZEXT416(auVar56._0_4_));
                      auVar56 = vfnmadd213ss_fma(auVar56,auVar61,SUB6416(ZEXT464(0x40000000),0));
                      fVar106 = auVar61._0_4_ * auVar56._0_4_;
                      auVar56 = vcvtsi2ss_avx512f(auVar127._0_16_,
                                                  *(ushort *)(lVar44 + 10 + lVar49) - 1);
                      auVar61 = vrcp14ss_avx512f(auVar40 << 0x20,ZEXT416(auVar56._0_4_));
                      auVar56 = vfnmadd213ss_fma(auVar56,auVar61,SUB6416(ZEXT464(0x40000000),0));
                      fStack_24c8 = auVar61._0_4_ * auVar56._0_4_;
                      auVar64 = vcvtdq2ps_avx(auVar64);
                      fVar93 = auVar64._28_4_ + auVar62._28_4_;
                      fVar103 = (local_24c0._0_4_ * auVar64._0_4_ + auVar62._0_4_) * fVar106;
                      fVar55 = (local_24c0._4_4_ * auVar64._4_4_ + auVar62._4_4_) * fVar106;
                      local_2500._4_4_ = fVar55;
                      local_2500._0_4_ = fVar103;
                      fVar89 = (local_24c0._8_4_ * auVar64._8_4_ + auVar62._8_4_) * fVar106;
                      local_2500._8_4_ = fVar89;
                      fVar90 = (local_24c0._12_4_ * auVar64._12_4_ + auVar62._12_4_) * fVar106;
                      local_2500._12_4_ = fVar90;
                      fVar91 = (local_24c0._16_4_ * auVar64._16_4_ + auVar62._16_4_) * fVar106;
                      local_2500._16_4_ = fVar91;
                      fVar92 = (local_24c0._20_4_ * auVar64._20_4_ + auVar62._20_4_) * fVar106;
                      local_2500._20_4_ = fVar92;
                      fVar106 = (local_24c0._24_4_ * auVar64._24_4_ + auVar62._24_4_) * fVar106;
                      local_2500._24_4_ = fVar106;
                      local_2500._28_4_ = fVar93;
                      auVar62 = vcvtdq2ps_avx(auVar65);
                      fStack_24c4 = auVar62._28_4_ + auVar63._28_4_;
                      local_24e0 = (local_24c0._0_4_ * auVar62._0_4_ + auVar63._0_4_) * fStack_24c8;
                      fStack_24dc = (local_24c0._4_4_ * auVar62._4_4_ + auVar63._4_4_) * fStack_24c8
                      ;
                      fStack_24d8 = (local_24c0._8_4_ * auVar62._8_4_ + auVar63._8_4_) * fStack_24c8
                      ;
                      fStack_24d4 = (local_24c0._12_4_ * auVar62._12_4_ + auVar63._12_4_) *
                                    fStack_24c8;
                      fStack_24d0 = (local_24c0._16_4_ * auVar62._16_4_ + auVar63._16_4_) *
                                    fStack_24c8;
                      fStack_24cc = (local_24c0._20_4_ * auVar62._20_4_ + auVar63._20_4_) *
                                    fStack_24c8;
                      fStack_24c8 = (local_24c0._24_4_ * auVar62._24_4_ + auVar63._24_4_) *
                                    fStack_24c8;
                      pGVar16 = (local_27a8->geometries).items[uVar53].ptr;
                      if ((pGVar16->mask & (ray->super_RayK<1>).mask) != 0) {
                        auVar32._8_4_ = 0x219392ef;
                        auVar32._0_8_ = 0x219392ef219392ef;
                        auVar32._12_4_ = 0x219392ef;
                        auVar32._16_4_ = 0x219392ef;
                        auVar32._20_4_ = 0x219392ef;
                        auVar32._24_4_ = 0x219392ef;
                        auVar32._28_4_ = 0x219392ef;
                        uVar48 = vcmpps_avx512vl(local_24c0,auVar32,5);
                        auVar62 = vrcp14ps_avx512vl(local_24c0);
                        auVar110._8_4_ = 0x3f800000;
                        auVar110._0_8_ = &DAT_3f8000003f800000;
                        auVar110._12_4_ = 0x3f800000;
                        auVar110._16_4_ = 0x3f800000;
                        auVar110._20_4_ = 0x3f800000;
                        auVar110._24_4_ = 0x3f800000;
                        auVar110._28_4_ = 0x3f800000;
                        auVar56 = vfnmadd213ps_fma(local_24c0,auVar62,auVar110);
                        auVar62 = vfmadd132ps_avx512vl(ZEXT1632(auVar56),auVar62,auVar62);
                        fVar1 = (float)((uint)((byte)uVar48 & 1) * auVar62._0_4_);
                        fVar2 = (float)((uint)((byte)(uVar48 >> 1) & 1) * auVar62._4_4_);
                        fVar3 = (float)((uint)((byte)(uVar48 >> 2) & 1) * auVar62._8_4_);
                        fVar4 = (float)((uint)((byte)(uVar48 >> 3) & 1) * auVar62._12_4_);
                        fVar5 = (float)((uint)((byte)(uVar48 >> 4) & 1) * auVar62._16_4_);
                        fVar6 = (float)((uint)((byte)(uVar48 >> 5) & 1) * auVar62._20_4_);
                        fVar94 = (float)((uint)((byte)(uVar48 >> 6) & 1) * auVar62._24_4_);
                        auVar38._4_4_ = fVar55 * fVar2;
                        auVar38._0_4_ = fVar103 * fVar1;
                        auVar38._8_4_ = fVar89 * fVar3;
                        auVar38._12_4_ = fVar90 * fVar4;
                        auVar38._16_4_ = fVar91 * fVar5;
                        auVar38._20_4_ = fVar92 * fVar6;
                        auVar38._24_4_ = fVar106 * fVar94;
                        auVar38._28_4_ = fVar93;
                        local_2480 = vminps_avx(auVar38,auVar110);
                        auVar39._4_4_ = fStack_24dc * fVar2;
                        auVar39._0_4_ = local_24e0 * fVar1;
                        auVar39._8_4_ = fStack_24d8 * fVar3;
                        auVar39._12_4_ = fStack_24d4 * fVar4;
                        auVar39._16_4_ = fStack_24d0 * fVar5;
                        auVar39._20_4_ = fStack_24cc * fVar6;
                        auVar39._24_4_ = fStack_24c8 * fVar94;
                        auVar39._28_4_ = fStack_24c4;
                        local_2460 = vminps_avx(auVar39,auVar110);
                        auVar111 = ZEXT3264(local_2440);
                        auVar98._8_4_ = 0x7f800000;
                        auVar98._0_8_ = 0x7f8000007f800000;
                        auVar98._12_4_ = 0x7f800000;
                        auVar98._16_4_ = 0x7f800000;
                        auVar98._20_4_ = 0x7f800000;
                        auVar98._24_4_ = 0x7f800000;
                        auVar98._28_4_ = 0x7f800000;
                        auVar62 = vblendmps_avx512vl(auVar98,local_2440);
                        auVar87._0_4_ =
                             (uint)(bVar41 & 1) * auVar62._0_4_ |
                             (uint)!(bool)(bVar41 & 1) * 0x7f800000;
                        bVar20 = (bool)((byte)(local_2498 >> 1) & 1);
                        auVar87._4_4_ = (uint)bVar20 * auVar62._4_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)((byte)(local_2498 >> 2) & 1);
                        auVar87._8_4_ = (uint)bVar20 * auVar62._8_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)((byte)(local_2498 >> 3) & 1);
                        auVar87._12_4_ = (uint)bVar20 * auVar62._12_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)((byte)(local_2498 >> 4) & 1);
                        auVar87._16_4_ = (uint)bVar20 * auVar62._16_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)((byte)(local_2498 >> 5) & 1);
                        auVar87._20_4_ = (uint)bVar20 * auVar62._20_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)((byte)(local_2498 >> 6) & 1);
                        auVar87._24_4_ = (uint)bVar20 * auVar62._24_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)((byte)(local_2498 >> 7) & 1);
                        auVar87._28_4_ = (uint)bVar20 * auVar62._28_4_ | (uint)!bVar20 * 0x7f800000;
                        auVar62 = vshufps_avx(auVar87,auVar87,0xb1);
                        auVar62 = vminps_avx(auVar87,auVar62);
                        auVar63 = vshufpd_avx(auVar62,auVar62,5);
                        auVar62 = vminps_avx(auVar62,auVar63);
                        auVar63 = vpermpd_avx2(auVar62,0x4e);
                        auVar62 = vminps_avx(auVar62,auVar63);
                        uVar22 = vcmpps_avx512vl(auVar87,auVar62,0);
                        bVar41 = (byte)uVar22 & bVar41;
                        uVar47 = (uint)bVar41;
                        if (bVar41 == 0) {
                          uVar47 = local_2498;
                        }
                        uVar48 = 0;
                        for (uVar46 = (ulong)(uVar47 & 0xff); (uVar46 & 1) == 0;
                            uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                          uVar48 = uVar48 + 1;
                        }
                        pRVar50 = context->args;
                        if ((pRVar50->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar106 = *(float *)(local_2480 + uVar48 * 4);
                          fVar103 = *(float *)(local_2460 + uVar48 * 4);
                          fVar55 = local_2420[uVar48];
                          fVar89 = local_2400[uVar48];
                          fVar90 = local_23e0[uVar48];
                          (ray->super_RayK<1>).tfar = local_2420[uVar48 - 8];
                          (ray->Ng).field_0.field_0.x = fVar55;
                          (ray->Ng).field_0.field_0.y = fVar89;
                          (ray->Ng).field_0.field_0.z = fVar90;
                          ray->u = fVar106;
                          ray->v = fVar103;
                          ray->primID = uVar15;
                          ray->geomID = uVar54;
                          pRVar19 = context->user;
                          ray->instID[0] = pRVar19->instID[0];
                          ray->instPrimID[0] = pRVar19->instPrimID[0];
                        }
                        else {
                          local_27b0 = context->user;
                          local_25c0 = local_2440;
                          local_2798 = pRVar50;
                          uVar54 = local_2498;
                          local_27b8 = uVar53;
                          do {
                            local_26c4 = *(undefined4 *)(local_2480 + uVar48 * 4);
                            local_26c0 = *(undefined4 *)(local_2460 + uVar48 * 4);
                            local_27a8 = (Scene *)CONCAT44(local_27a8._4_4_,
                                                           (ray->super_RayK<1>).tfar);
                            (ray->super_RayK<1>).tfar = local_2420[uVar48 - 8];
                            local_26d0 = local_2420[uVar48];
                            local_26cc = local_2400[uVar48];
                            local_26c8 = local_23e0[uVar48];
                            local_26bc = (int)local_2790;
                            local_26b8 = (int)uVar53;
                            local_26b4 = local_27b0->instID[0];
                            local_26b0 = local_27b0->instPrimID[0];
                            local_279c = -1;
                            local_2700.valid = &local_279c;
                            local_2700.geometryUserPtr = pGVar16->userPtr;
                            local_2700.context = local_27b0;
                            local_2700.ray = (RTCRayN *)ray;
                            local_2700.hit = (RTCHitN *)&local_26d0;
                            local_2700.N = 1;
                            if (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01fdd0af:
                              if (pRVar50->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar50->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar16->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar50->filter)(&local_2700);
                                  auVar111 = ZEXT3264(local_25c0);
                                  auVar131 = ZEXT3264(local_2680);
                                  auVar130 = ZEXT3264(local_2660);
                                  auVar129 = ZEXT3264(local_2640);
                                  auVar128 = ZEXT3264(local_2620);
                                  auVar127 = ZEXT3264(local_2600);
                                  pRVar50 = local_2798;
                                  uVar53 = local_27b8;
                                }
                                if (*local_2700.valid == 0) goto LAB_01fdd175;
                              }
                              (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_2700.hit;
                              (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_2700.hit + 4);
                              (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_2700.hit + 8);
                              *(float *)((long)local_2700.ray + 0x3c) =
                                   *(float *)(local_2700.hit + 0xc);
                              *(float *)((long)local_2700.ray + 0x40) =
                                   *(float *)(local_2700.hit + 0x10);
                              *(float *)((long)local_2700.ray + 0x44) =
                                   *(float *)(local_2700.hit + 0x14);
                              *(float *)((long)local_2700.ray + 0x48) =
                                   *(float *)(local_2700.hit + 0x18);
                              *(float *)((long)local_2700.ray + 0x4c) =
                                   *(float *)(local_2700.hit + 0x1c);
                              *(float *)((long)local_2700.ray + 0x50) =
                                   *(float *)(local_2700.hit + 0x20);
                            }
                            else {
                              (*pGVar16->intersectionFilterN)(&local_2700);
                              auVar111 = ZEXT3264(local_25c0);
                              auVar131 = ZEXT3264(local_2680);
                              auVar130 = ZEXT3264(local_2660);
                              auVar129 = ZEXT3264(local_2640);
                              auVar128 = ZEXT3264(local_2620);
                              auVar127 = ZEXT3264(local_2600);
                              pRVar50 = local_2798;
                              uVar53 = local_27b8;
                              if (*local_2700.valid != 0) goto LAB_01fdd0af;
LAB_01fdd175:
                              (ray->super_RayK<1>).tfar = local_27a8._0_4_;
                            }
                            bVar25 = ~(byte)(1 << ((uint)uVar48 & 0x1f)) & (byte)uVar54;
                            fVar106 = (ray->super_RayK<1>).tfar;
                            auVar33._4_4_ = fVar106;
                            auVar33._0_4_ = fVar106;
                            auVar33._8_4_ = fVar106;
                            auVar33._12_4_ = fVar106;
                            auVar33._16_4_ = fVar106;
                            auVar33._20_4_ = fVar106;
                            auVar33._24_4_ = fVar106;
                            auVar33._28_4_ = fVar106;
                            uVar22 = vcmpps_avx512vl(auVar111._0_32_,auVar33,2);
                            bVar41 = bVar25 & (byte)uVar22;
                            uVar54 = (uint)bVar41;
                            if ((bVar25 & (byte)uVar22) != 0) {
                              auVar99._8_4_ = 0x7f800000;
                              auVar99._0_8_ = 0x7f8000007f800000;
                              auVar99._12_4_ = 0x7f800000;
                              auVar99._16_4_ = 0x7f800000;
                              auVar99._20_4_ = 0x7f800000;
                              auVar99._24_4_ = 0x7f800000;
                              auVar99._28_4_ = 0x7f800000;
                              auVar62 = vblendmps_avx512vl(auVar99,auVar111._0_32_);
                              auVar88._0_4_ =
                                   (uint)(bVar41 & 1) * auVar62._0_4_ |
                                   (uint)!(bool)(bVar41 & 1) * 0x7f800000;
                              bVar20 = (bool)(bVar41 >> 1 & 1);
                              auVar88._4_4_ =
                                   (uint)bVar20 * auVar62._4_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar41 >> 2 & 1);
                              auVar88._8_4_ =
                                   (uint)bVar20 * auVar62._8_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar41 >> 3 & 1);
                              auVar88._12_4_ =
                                   (uint)bVar20 * auVar62._12_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar41 >> 4 & 1);
                              auVar88._16_4_ =
                                   (uint)bVar20 * auVar62._16_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar41 >> 5 & 1);
                              auVar88._20_4_ =
                                   (uint)bVar20 * auVar62._20_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar41 >> 6 & 1);
                              auVar88._24_4_ =
                                   (uint)bVar20 * auVar62._24_4_ | (uint)!bVar20 * 0x7f800000;
                              auVar88._28_4_ =
                                   (uint)(bVar41 >> 7) * auVar62._28_4_ |
                                   (uint)!(bool)(bVar41 >> 7) * 0x7f800000;
                              auVar62 = vshufps_avx(auVar88,auVar88,0xb1);
                              auVar62 = vminps_avx(auVar88,auVar62);
                              auVar63 = vshufpd_avx(auVar62,auVar62,5);
                              auVar62 = vminps_avx(auVar62,auVar63);
                              auVar63 = vpermpd_avx2(auVar62,0x4e);
                              auVar62 = vminps_avx(auVar62,auVar63);
                              uVar22 = vcmpps_avx512vl(auVar88,auVar62,0);
                              bVar42 = (byte)uVar22 & bVar41;
                              bVar25 = bVar41;
                              if (bVar42 != 0) {
                                bVar25 = bVar42;
                              }
                              uVar15 = 0;
                              for (uVar47 = (uint)bVar25; (uVar47 & 1) == 0;
                                  uVar47 = uVar47 >> 1 | 0x80000000) {
                                uVar15 = uVar15 + 1;
                              }
                              uVar48 = (ulong)uVar15;
                            }
                          } while (bVar41 != 0);
                        }
                      }
                    }
                  }
                }
                local_2708 = local_2708 - 1 & local_2708;
              } while (local_2708 != 0);
            }
            local_2718 = local_2718 + 1;
          } while (local_2718 != local_2750);
        }
        local_25e0 = (ray->super_RayK<1>).tfar;
        fStack_25dc = local_25e0;
        fStack_25d8 = local_25e0;
        fStack_25d4 = local_25e0;
        fStack_25d0 = local_25e0;
        fStack_25cc = local_25e0;
        fStack_25c8 = local_25e0;
        fStack_25c4 = local_25e0;
        auVar116 = ZEXT3264(_local_2580);
        auVar113 = ZEXT3264(_local_25a0);
        auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar114 = ZEXT3264(auVar62);
        auVar111 = ZEXT3264(CONCAT428(0xfffffff8,
                                      CONCAT424(0xfffffff8,
                                                CONCAT420(0xfffffff8,
                                                          CONCAT416(0xfffffff8,
                                                                    CONCAT412(0xfffffff8,
                                                                              CONCAT48(0xfffffff8,
                                                                                                                                                                              
                                                  0xfffffff8fffffff8)))))));
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }